

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * cmGlobalNinjaMultiGenerator::GetNinjaConfigFilename
                   (string *__return_storage_ptr__,string *config)

{
  char *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  size_t local_38;
  char *local_30;
  undefined8 local_28;
  
  pcVar1 = NINJA_FILE_EXTENSION;
  local_68.first._M_len = 6;
  local_68.first._M_str = "build-";
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (config->_M_dataplus)._M_p;
  local_50 = config->_M_string_length;
  local_40 = 0;
  local_38 = strlen(NINJA_FILE_EXTENSION);
  local_30 = pcVar1;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::GetNinjaConfigFilename(
  const std::string& config)
{
  return cmStrCat("build-", config,
                  cmGlobalNinjaMultiGenerator::NINJA_FILE_EXTENSION);
}